

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O2

void Question_4(void)

{
  _Rb_tree_header *p_Var1;
  _Self __tmp;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  int iVar5;
  int i;
  _Rb_tree_color _Var6;
  int n;
  int num;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  int local_60;
  int local_5c;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_58;
  
  std::istream::operator>>((istream *)&std::cin,&local_60);
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Var6 = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; (int)_Var6 < local_60; _Var6 = _Var6 + _S_black) {
    std::istream::operator>>((istream *)&std::cin,&local_5c);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_58,&local_5c);
    *pmVar2 = *pmVar2 + 1;
  }
  iVar5 = 0;
  for (p_Var3 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (iVar5 < *(int *)&p_Var3[1].field_0x4) {
      _Var6 = p_Var3[1]._M_color;
      iVar5 = *(int *)&p_Var3[1].field_0x4;
    }
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var6);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<(poVar4,iVar5);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void Question_4()
{
    int n,num,ans1,ans2 = 0;
    cin >>n;
    map<int,int > m;
    for (int i = 0; i < n; ++i) {
        cin >> num;
        m[num]++;
    }
    for (map<int,int>::iterator it = m.begin(); it != m.end(); it ++)
    {
        if((it->second) > ans2)  //找到其中次数最多的
        {
            ans2 = it -> second;
            ans1 = it -> first;
        }
    }
    cout << ans1 << " " << ans2;
}